

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIPSolution.cpp
# Opt level: O2

JointPolicyPureVectorForClusteredBG * __thiscall
BGIPSolution::GetJointPolicyPureVectorForClusteredBG(BGIPSolution *this)

{
  element_type *peVar1;
  shared_ptr<PartialJointPolicyDiscretePure> local_30;
  JointPolicyPureVectorForClusteredBG *local_20;
  shared_count local_18;
  
  if (this->_m_useFixedCapacityPriorityQueue == true) {
    peVar1 = (element_type *)
             (this->_m_qpFixedK)._m_l.
             super__List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
             ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
  }
  else {
    peVar1 = ((this->_m_qpInfSize->c).
              super__Vector_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->px;
  }
  (**(code **)(*(long *)&peVar1->super_PartialJointPolicyValuePair + 0x10))(&local_30);
  boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,PartialJointPolicyDiscretePure>
            ((boost *)&local_20,&local_30);
  boost::detail::shared_count::~shared_count(&local_18);
  boost::detail::shared_count::~shared_count(&local_30.pn);
  return local_20;
}

Assistant:

const JointPolicyPureVectorForClusteredBG& 
BGIPSolution::GetJointPolicyPureVectorForClusteredBG() const 
{
    if(_m_useFixedCapacityPriorityQueue)
        return(*boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG>(
                   _m_qpFixedK.top()->GetJPol()));
    else
        return(*boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG>(
                   _m_qpInfSize->top()->GetJPol()));
}